

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O2

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,ExpressionList *expression_list)

{
  pointer ppEVar1;
  ExpressionList *this_00;
  pointer ppEVar2;
  IRTStorage local_40;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_00161f48;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppEVar1 = (expression_list->expressions_).
            super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar2 = (expression_list->expressions_).
                 super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1) {
    TemplateVisitor<IRT::IRTStorage>::Accept
              (&local_40,&this->super_TemplateVisitor<IRT::IRTStorage>,
               &(*ppEVar2)->super_BaseElement);
    ExpressionList::Add(this_00,local_40.expression_);
  }
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_list_ = this_00;
  return;
}

Assistant:

void BlockFormerVisitor::Visit(ExpressionList* expression_list) {
  auto new_expression_list = new ExpressionList();

  for (Expression* expression : expression_list->expressions_) {
    new_expression_list->Add(Accept(expression).expression_);
  }

  tos_value_.expression_list_ = new_expression_list;
}